

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Statement * __thiscall
soul::ResolutionPass::ErrorIgnoringRewritingASTVisitor::visit
          (ErrorIgnoringRewritingASTVisitor *this,IfStatement *i)

{
  size_t *psVar1;
  bool bVar2;
  Statement *pSVar3;
  pool_ptr<soul::AST::Constant> constant;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  long local_20;
  
  if (i->isConstIf == true) {
    RewritingASTVisitor::replaceExpression(&this->super_RewritingASTVisitor,&i->condition);
    (*(((i->condition).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_20);
    if (local_20 == 0) {
      this->numFails = this->numFails + 1;
      if (this->ignoreErrors == true) {
        local_28 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/compiler/soul_ResolutionPass.h:172:43)>
                   ::_M_invoke;
        local_30 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/compiler/soul_ResolutionPass.h:172:43)>
                   ::_M_manager;
        local_40._M_unused._M_object = this;
        local_40._8_8_ = i;
        catchParseErrors((function<void_()> *)&local_40);
        if (local_30 != (code *)0x0) {
          (*local_30)(&local_40,&local_40,__destroy_functor);
        }
      }
    }
    else {
      soul::Value::getData((PackedData *)&local_40,(Value *)(local_20 + 0x30));
      bVar2 = soul::Value::PackedData::getAsBool((PackedData *)&local_40);
      if (bVar2) {
        pSVar3 = RewritingASTVisitor::visitObject
                           (&this->super_RewritingASTVisitor,(i->trueBranch).object);
        if ((i->trueBranch).object != pSVar3) {
          psVar1 = &(this->super_RewritingASTVisitor).itemsReplaced;
          *psVar1 = *psVar1 + 1;
          (i->trueBranch).object = pSVar3;
        }
      }
      else if ((i->falseBranch).object != (Statement *)0x0) {
        RewritingASTVisitor::replaceStatement(&this->super_RewritingASTVisitor,&i->falseBranch);
      }
    }
    return &i->super_Statement;
  }
  pSVar3 = RewritingASTVisitor::visit(&this->super_RewritingASTVisitor,i);
  return pSVar3;
}

Assistant:

AST::Statement& visit (AST::IfStatement& i) override
        {
            if (i.isConstIf)
            {
                replaceExpression (i.condition);

                if (auto constant = i.condition->getAsConstant())
                {
                    if (constant->value.getAsBool())
                        replaceStatement (i.trueBranch);
                    else if (i.falseBranch != nullptr)
                        replaceStatement (i.falseBranch);
                }
                else
                {
                    ++numFails;

                    if (ignoreErrors)
                    {
                        catchParseErrors ([this, &i]
                        {
                            replaceStatement (i.trueBranch);
                            replaceStatement (i.falseBranch);
                        });
                    }
                }

                return i;
            }

            return RewritingASTVisitor::visit (i);
        }